

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall cmInstallExportGenerator::ComputeTempDir(cmInstallExportGenerator *this)

{
  string *psVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  undefined1 *puVar7;
  char local_aa [2];
  char *local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  char local_92 [2];
  char *local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined1 local_80 [8];
  string dest;
  string local_50;
  ulong local_30;
  size_type max_len;
  size_type len;
  size_type max_total_len;
  cmInstallExportGenerator *pcStack_10;
  bool useMD5;
  cmInstallExportGenerator *this_local;
  
  pcStack_10 = this;
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  std::__cxx11::string::operator=((string *)&this->TempDir,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)&this->TempDir,"/CMakeFiles");
  std::__cxx11::string::operator+=((string *)&this->TempDir,"/Export");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&this->TempDir,"/");
    max_total_len._7_1_ = 0;
    len = 1000;
    lVar3 = std::__cxx11::string::size();
    lVar4 = std::__cxx11::string::size();
    sVar5 = GetMaxConfigLength(this);
    max_len = lVar3 + lVar4 + 2 + sVar5;
    if (max_len < 1000) {
      local_30 = 1000 - max_len;
      uVar2 = std::__cxx11::string::size();
      if (local_30 < uVar2) {
        max_total_len._7_1_ = 1;
      }
    }
    else {
      max_total_len._7_1_ = 1;
    }
    if ((max_total_len._7_1_ & 1) == 0) {
      std::__cxx11::string::string
                ((string *)local_80,(string *)&(this->super_cmInstallGenerator).Destination);
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
      if (*pcVar6 == '/') {
        puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_80);
        *puVar7 = 0x5f;
      }
      local_88._M_current = (char *)std::__cxx11::string::begin();
      local_90 = (char *)std::__cxx11::string::end();
      local_92[1] = 0x3a;
      local_92[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_88,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_90,local_92 + 1,local_92);
      cmsys::SystemTools::ReplaceString((string *)local_80,"../","__/");
      local_a0._M_current = (char *)std::__cxx11::string::begin();
      local_a8 = (char *)std::__cxx11::string::end();
      local_aa[1] = 0x20;
      local_aa[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_a0,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_a8,local_aa + 1,local_aa);
      std::__cxx11::string::operator+=((string *)&this->TempDir,(string *)local_80);
      std::__cxx11::string::~string((string *)local_80);
    }
    else {
      cmSystemTools::ComputeStringMD5(&local_50,&(this->super_cmInstallGenerator).Destination);
      std::__cxx11::string::operator+=((string *)&this->TempDir,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void cmInstallExportGenerator::ComputeTempDir()
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  this->TempDir = this->LocalGenerator->GetCurrentBinaryDirectory();
  this->TempDir += "/CMakeFiles";
  this->TempDir += "/Export";
  if (this->Destination.empty()) {
    return;
  }
  this->TempDir += "/";

  // Enforce a maximum length.
  bool useMD5 = false;
#if defined(_WIN32) || defined(__CYGWIN__)
  std::string::size_type const max_total_len = 250;
#else
  std::string::size_type const max_total_len = 1000;
#endif
  // Will generate files of the form "<temp-dir>/<base>-<config>.<ext>".
  std::string::size_type const len = this->TempDir.size() + 1 +
    this->FileName.size() + 1 + this->GetMaxConfigLength();
  if (len < max_total_len) {
    // Keep the total path length below the limit.
    std::string::size_type const max_len = max_total_len - len;
    if (this->Destination.size() > max_len) {
      useMD5 = true;
    }
  } else {
    useMD5 = true;
  }
  if (useMD5) {
    // Replace the destination path with a hash to keep it short.
    this->TempDir += cmSystemTools::ComputeStringMD5(this->Destination);
  } else {
    std::string dest = this->Destination;
    // Avoid unix full paths.
    if (dest[0] == '/') {
      dest[0] = '_';
    }
    // Avoid windows full paths by removing colons.
    std::replace(dest.begin(), dest.end(), ':', '_');
    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(dest, "../", "__/");
    // Avoid spaces.
    std::replace(dest.begin(), dest.end(), ' ', '_');
    this->TempDir += dest;
  }
}